

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# download.cpp
# Opt level: O0

int Download::ThreadDownloadFile(string *url,string *savePath)

{
  undefined8 uVar1;
  char *__filename;
  FILE *__stream;
  undefined8 uVar2;
  CURLcode res;
  FILE *outFp;
  CURL *downloadHandle;
  string *savePath_local;
  string *url_local;
  
  uVar1 = curl_easy_init();
  __filename = (char *)std::__cxx11::string::c_str();
  __stream = fopen(__filename,"wb");
  if (__stream == (FILE *)0x0) {
    memset(&msg,0,0x400);
    uVar1 = std::__cxx11::string::c_str();
    sprintf(&msg,"fopen %s failed",uVar1);
    CodeLog::PrintLog("ERROR",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/by415[P]Download/download.cpp"
                      ,"ThreadDownloadFile",0x52,&msg);
    url_local._4_4_ = 0xffffffff;
  }
  else {
    uVar2 = std::__cxx11::string::c_str();
    curl_easy_setopt(uVar1,0x2712,uVar2);
    curl_easy_setopt(uVar1,0x4e2b,CallBackDownloadData);
    curl_easy_setopt(uVar1,0x2711,__stream);
    url_local._4_4_ = curl_easy_perform(uVar1);
    if (url_local._4_4_ == 0) {
      curl_easy_cleanup(uVar1);
      fclose(__stream);
      memset(&msg,0,0x400);
      sprintf(&msg,"curl_easy_perform success return val = %u",0);
      CodeLog::PrintLog("INFO",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/by415[P]Download/download.cpp"
                        ,"ThreadDownloadFile",0x61,&msg);
    }
    else {
      memset(&msg,0,0x400);
      sprintf(&msg,"curl_easy_perform failed return val = %u",(ulong)url_local._4_4_);
      CodeLog::PrintLog("ERROR",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/by415[P]Download/download.cpp"
                        ,"ThreadDownloadFile",0x5c,&msg);
    }
  }
  return url_local._4_4_;
}

Assistant:

int Download::ThreadDownloadFile(const std::string &url,const std::string &savePath)
{
    CURL *downloadHandle = curl_easy_init();
    
    FILE *outFp = NULL;
    outFp = fopen(savePath.c_str(),"wb");
    if(NULL == outFp)
    {
        LOG_ERROR("fopen %s failed",savePath.c_str());
        return -1;
    }
    curl_easy_setopt(downloadHandle,CURLOPT_URL,url.c_str());
    curl_easy_setopt(downloadHandle,CURLOPT_WRITEFUNCTION,&CallBackDownloadData);
    curl_easy_setopt(downloadHandle,CURLOPT_WRITEDATA,outFp);
    
    CURLcode res = curl_easy_perform(downloadHandle);
    if(res != CURLE_OK)
    {
        LOG_ERROR("curl_easy_perform failed return val = %u",res);
        return res;
    }
    curl_easy_cleanup(downloadHandle);	//clean up the curl handle
	fclose(outFp);	//close the file
	LOG_INFO("curl_easy_perform success return val = %u",res);
    return res;
}